

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValue.cpp
# Opt level: O2

XMLCh * xercesc_4_0::XSValue::getCanRepStrings
                  (XMLCh *content,DataType datatype,Status *status,XMLVersion version,
                  bool toValidate,MemoryManager *manager)

{
  Status SVar1;
  bool bVar2;
  XMLCh *toDelete;
  XMLCh *pXVar3;
  ArrayJanitor<char16_t> janTmpName;
  
  switch(datatype) {
  case dt_string:
  case dt_anyURI:
  case dt_QName:
  case dt_NOTATION:
  case dt_normalizedString:
  case dt_token:
  case dt_language:
  case dt_NMTOKEN:
  case dt_NMTOKENS:
  case dt_Name:
  case dt_NCName:
  case dt_ID:
  case dt_IDREF:
  case dt_IDREFS:
  case dt_ENTITY:
  case dt_ENTITIES:
    if ((!toValidate) || (bVar2 = validateStrings(content,datatype,status,version,manager), bVar2))
    {
      SVar1 = st_NoCanRep;
    }
    else {
      SVar1 = st_FOCA0002;
    }
    *status = SVar1;
    break;
  case dt_boolean:
    toDelete = XMLString::replicate(content,manager);
    ArrayJanitor<char16_t>::ArrayJanitor(&janTmpName,toDelete,manager);
    XMLString::trim(toDelete);
    bVar2 = XMLString::equals(toDelete,(XMLCh *)XMLUni::fgBooleanValueSpace);
    pXVar3 = (XMLCh *)XMLUni::fgBooleanValueSpace;
    if (!bVar2) {
      bVar2 = XMLString::equals(toDelete,(XMLCh *)(XMLUni::fgBooleanValueSpace + 0x20));
      pXVar3 = (XMLCh *)XMLUni::fgBooleanValueSpace;
      if (!bVar2) {
        bVar2 = XMLString::equals(toDelete,(XMLCh *)(XMLUni::fgBooleanValueSpace + 0x10));
        pXVar3 = (XMLCh *)(XMLUni::fgBooleanValueSpace + 0x10);
        if ((!bVar2) &&
           (bVar2 = XMLString::equals(toDelete,(XMLCh *)(XMLUni::fgBooleanValueSpace + 0x30)),
           pXVar3 = (XMLCh *)(XMLUni::fgBooleanValueSpace + 0x10), !bVar2)) {
          *status = st_FOCA0002;
          pXVar3 = (XMLCh *)0x0;
          goto LAB_00298139;
        }
      }
    }
    pXVar3 = XMLString::replicate(pXVar3,manager);
    goto LAB_00298139;
  case dt_hexBinary:
    pXVar3 = XMLString::replicate(content,manager);
    ArrayJanitor<char16_t>::ArrayJanitor(&janTmpName,pXVar3,manager);
    XMLString::trim(pXVar3);
    pXVar3 = HexBin::getCanonicalRepresentation(pXVar3,manager);
    if (pXVar3 == (XMLCh *)0x0) {
      *status = st_FOCA0002;
    }
LAB_00298139:
    ArrayJanitor<char16_t>::~ArrayJanitor(&janTmpName);
    return pXVar3;
  case dt_base64Binary:
    pXVar3 = Base64::getCanonicalRepresentation(content,manager,Conf_RFC2045);
    if (pXVar3 != (XMLCh *)0x0) {
      return pXVar3;
    }
    *status = st_FOCA0002;
  }
  return (XMLCh *)0x0;
}

Assistant:

XMLCh* XSValue::getCanRepStrings(const XMLCh*         const content
                               ,       DataType             datatype
                               ,       Status&              status
                               ,       XMLVersion           version
                               ,       bool                 toValidate
                               ,       MemoryManager* const manager)
{
    switch (datatype) {
        case XSValue::dt_boolean:
            {
            XMLCh* tmpStrValue = XMLString::replicate(content, manager);
            ArrayJanitor<XMLCh> janTmpName(tmpStrValue, manager);
            XMLString::trim(tmpStrValue);
            //always validate before getting canRep
            if (XMLString::equals(tmpStrValue, XMLUni::fgBooleanValueSpace[0]) ||
                XMLString::equals(tmpStrValue, XMLUni::fgBooleanValueSpace[2])  )
            {
                return XMLString::replicate(XMLUni::fgBooleanValueSpace[0], manager);
            }
            else if (XMLString::equals(tmpStrValue, XMLUni::fgBooleanValueSpace[1]) ||
                     XMLString::equals(tmpStrValue, XMLUni::fgBooleanValueSpace[3])  )
            {
                return XMLString::replicate(XMLUni::fgBooleanValueSpace[1], manager);
            }
            else
            {
                status = st_FOCA0002;
                return 0;
            }
            }
            break;
        case XSValue::dt_hexBinary:
            {
                //HexBin::getCanonicalRepresentation does validation automatically
                XMLCh* tmpStrValue = XMLString::replicate(content, manager);
                ArrayJanitor<XMLCh> janTmpName(tmpStrValue, manager);
                XMLString::trim(tmpStrValue);

                XMLCh* canRep = HexBin::getCanonicalRepresentation(tmpStrValue, manager);
                if (!canRep)
                    status = st_FOCA0002;

                return canRep;
                break;
            }
        case XSValue::dt_base64Binary:
            {
                //Base64::getCanonicalRepresentation does validation automatically
                XMLCh* canRep = Base64::getCanonicalRepresentation(content, manager);
                if (!canRep)
                    status = st_FOCA0002;

                return canRep;
                break;
            }
        case XSValue::dt_anyURI:
        case XSValue::dt_QName:
        case XSValue::dt_NOTATION:
        case XSValue::dt_string:
        case XSValue::dt_normalizedString:
        case XSValue::dt_token:
        case XSValue::dt_language:
        case XSValue::dt_NMTOKEN:
        case XSValue::dt_NMTOKENS:
        case XSValue::dt_Name:
        case XSValue::dt_NCName:
        case XSValue::dt_ID:
        case XSValue::dt_IDREF:
        case XSValue::dt_ENTITY:
        case XSValue::dt_ENTITIES:
        case XSValue::dt_IDREFS:
            if (toValidate && !validateStrings(content, datatype, status, version, manager))
                status = st_FOCA0002;
            else
                status = st_NoCanRep;

            return 0;
            break;
        default:
            return 0;
            break;
    }

    return 0;
}